

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O2

void __thiscall cppnet::Dispatcher::Listen(Dispatcher *this,uint64_t sock,string *ip,uint16_t port)

{
  pthread_t pVar1;
  __0 *this_00;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  anon_class_56_4_e8c7a8e2 task;
  
  task.sock = sock;
  std::__cxx11::string::string((string *)&task.ip,(string *)ip);
  task.port = port;
  task.this = this;
  pVar1 = pthread_self();
  if (pVar1 == (this->_local_thread_id)._M_thread) {
    Listen::anon_class_56_4_e8c7a8e2::operator()(&task);
  }
  else {
    local_68 = (code *)0x0;
    pcStack_60 = (code *)0x0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    this_00 = (__0 *)operator_new(0x38);
    Listen(unsigned_long,std::__cxx11::string_const&,unsigned_short)::$_0::__0(this_00,&task);
    pcStack_60 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/dispatcher.cpp:87:17)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/dispatcher.cpp:87:17)>
               ::_M_manager;
    local_78._M_unused._0_8_ = (undefined8)this_00;
    PostTask(this,(Task *)&local_78);
    std::_Function_base::~_Function_base((_Function_base *)&local_78);
  }
  std::__cxx11::string::~string((string *)&task.ip);
  return;
}

Assistant:

void Dispatcher::Listen(uint64_t sock, const std::string& ip, uint16_t port) {
    auto task = [sock, ip, port, this]() {
        auto connect_sock = MakeConnectSocket();
        connect_sock->SetEventActions(_event_actions);
        connect_sock->SetCppNetBase(_cppnet_base.lock());
        connect_sock->SetSocket(sock);
        connect_sock->SetDispatcher(shared_from_this());

        connect_sock->Bind(ip, port);
        connect_sock->Listen();
    };

    if (std::this_thread::get_id() == _local_thread_id) {
        task();

    } else {
        PostTask(task);
    }
}